

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

void * lyplg_type_print_bits
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  LY_ERR LVar1;
  char *pcVar2;
  char *local_58;
  char *ret;
  lyd_value_bits *val;
  lysc_type_bits *type_bits;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  lyd_value *plStack_20;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *ctx_local;
  
  val = (lyd_value_bits *)value->realtype;
  ret = (char *)&value->field_2;
  type_bits = (lysc_type_bits *)value_len;
  value_len_local = (size_t *)dynamic;
  dynamic_local = (ly_bool *)UNUSED_prefix_data;
  UNUSED_prefix_data_local._4_4_ = format;
  plStack_20 = value;
  value_local = (lyd_value *)ctx;
  if (format == LY_VALUE_LYB) {
    *dynamic = '\0';
    if (value_len != (size_t *)0x0) {
      pcVar2 = (char *)lyplg_type_bits_bitmap_size((lysc_type_bits *)val);
      type_bits->name = pcVar2;
    }
    return *(void **)ret;
  }
  if (value->_canonical == (char *)0x0) {
    LVar1 = bits_items2canon(*(lysc_type_bitenum_item ***)((long)&value->field_2 + 8),&local_58);
    if (LVar1 != LY_SUCCESS) {
      return (void *)0x0;
    }
    LVar1 = lydict_insert_zc((ly_ctx *)value_local,local_58,&plStack_20->_canonical);
    if (LVar1 != LY_SUCCESS) {
      ly_log((ly_ctx *)value_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyplg_type_print_bits");
      return (void *)0x0;
    }
  }
  if (value_len_local != (size_t *)0x0) {
    *(undefined1 *)value_len_local = 0;
  }
  if (type_bits != (lysc_type_bits *)0x0) {
    pcVar2 = (char *)strlen(plStack_20->_canonical);
    type_bits->name = pcVar2;
  }
  return plStack_20->_canonical;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_bits(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)value->realtype;
    struct lyd_value_bits *val;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        *dynamic = 0;
        if (value_len) {
            *value_len = lyplg_type_bits_bitmap_size(type_bits);
        }
        return val->bitmap;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* get the canonical value */
        if (bits_items2canon(val->items, &ret)) {
            return NULL;
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}